

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkBinaryRegistry.cpp
# Opt level: O1

string * vk::BinaryRegistryDetail::anon_unknown_8::getProgramPath
                   (string *__return_storage_ptr__,string *dirName,deUint32 index)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  long lVar4;
  long *plVar5;
  long *plVar6;
  long *local_248;
  long local_238;
  long lStack_230;
  FilePath local_228;
  FilePath local_208;
  FilePath local_1e8;
  long *local_1c8 [2];
  long local_1b8 [2];
  Hex<8UL> local_1a8;
  ostringstream local_1a0 [112];
  ios_base local_130 [264];
  
  paVar1 = &local_208.m_path.field_2;
  pcVar3 = (dirName->_M_dataplus)._M_p;
  local_208.m_path._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_208,pcVar3,pcVar3 + dirName->_M_string_length);
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  local_1a8.value = (deUint64)index;
  tcu::Format::Hex<8UL>::toStream(&local_1a8,(ostream *)local_1a0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  std::ios_base::~ios_base(local_130);
  plVar5 = (long *)std::__cxx11::string::append((char *)local_1c8);
  plVar6 = plVar5 + 2;
  if ((long *)*plVar5 == plVar6) {
    local_238 = *plVar6;
    lStack_230 = plVar5[3];
    local_248 = &local_238;
  }
  else {
    local_238 = *plVar6;
    local_248 = (long *)*plVar5;
  }
  lVar4 = plVar5[1];
  *plVar5 = (long)plVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if (local_1c8[0] != local_1b8) {
    operator_delete(local_1c8[0],local_1b8[0] + 1);
  }
  paVar2 = &local_228.m_path.field_2;
  local_228.m_path._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_228,local_248,lVar4 + (long)local_248);
  de::FilePath::join(&local_1e8,&local_208,&local_228);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,local_1e8.m_path._M_dataplus._M_p,
             (allocator<char> *)local_1a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8.m_path._M_dataplus._M_p != &local_1e8.m_path.field_2) {
    operator_delete(local_1e8.m_path._M_dataplus._M_p,
                    local_1e8.m_path.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228.m_path._M_dataplus._M_p != paVar2) {
    operator_delete(local_228.m_path._M_dataplus._M_p,
                    local_228.m_path.field_2._M_allocated_capacity + 1);
  }
  if (local_248 != &local_238) {
    operator_delete(local_248,local_238 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208.m_path._M_dataplus._M_p != paVar1) {
    operator_delete(local_208.m_path._M_dataplus._M_p,
                    local_208.m_path.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

string getProgramPath (const std::string& dirName, deUint32 index)
{
	return de::FilePath::join(dirName, getProgramFileName(index)).getPath();
}